

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O2

int __thiscall
boost::wrapexcept<boost::xpressive::regex_error>::clone
          (wrapexcept<boost::xpressive::regex_error> *this,__fn *__fn,void *__child_stack,
          int __flags,void *__arg,...)

{
  wrapexcept<boost::xpressive::regex_error> *this_00;
  
  this_00 = (wrapexcept<boost::xpressive::regex_error> *)operator_new(0x48);
  wrapexcept(this_00,this);
  exception_detail::copy_boost_exception
            (&(this_00->super_regex_error).super_exception,
             &(this->super_regex_error).super_exception);
  return (int)this_00;
}

Assistant:

virtual boost::exception_detail::clone_base const * clone() const BOOST_OVERRIDE
    {
        wrapexcept * p = new wrapexcept( *this );
        deleter del = { p };

        boost::exception_detail::copy_boost_exception( p, this );

        del.p_ = BOOST_NULLPTR;
        return p;
    }